

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint __thiscall ON_V4V5_MeshNgonList::V4V5_SizeOf(ON_V4V5_MeshNgonList *this)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)this->m_ngons_count;
  if (this->m_ngons_count < 1) {
    uVar3 = uVar1;
  }
  iVar2 = 0;
  for (; uVar3 * 0x18 - uVar1 != 0; uVar1 = uVar1 + 0x18) {
    iVar2 = iVar2 + *(int *)((long)&this->m_ngons->N + uVar1) * 2;
  }
  return this->m_ngons_capacity * 0x18 + iVar2 * 4 + 0x18;
}

Assistant:

unsigned int ON_V4V5_MeshNgonList::V4V5_SizeOf() const
{
  unsigned int sz = sizeof(*this);
  int icount = 0;
  for ( int i = 0; i < m_ngons_count; i++ )
  {
    icount += 2*m_ngons[i].N;
  }
  sz += m_ngons_capacity*sizeof(m_ngons[0]);
  sz += icount*sizeof(int);
  return sz;
}